

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

uint __thiscall
llvm::DWARFVerifier::verifyNameIndexAttribute
          (DWARFVerifier *this,NameIndex *NI,Abbrev *Abbr,AttributeEncoding AttrEnc)

{
  bool bVar1;
  raw_ostream *prVar2;
  uint uVar3;
  StringRef SVar4;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<const_llvm::StringLiteral_&>_>_>
  local_e0;
  Form local_4a;
  uint64_t local_48;
  DWARFVerifier *local_40;
  AttributeEncoding local_38;
  AttributeEncoding AttrEnc_local;
  
  local_38 = AttrEnc;
  SVar4 = dwarf::FormEncodingString(AttrEnc._4_4_ & 0xffff);
  if (SVar4.Length == 0) {
    prVar2 = error(this);
    local_48 = NI->Base;
    formatv<unsigned_long,_const_unsigned_int_&,_llvm::dwarf::Index_&,_llvm::dwarf::Form_&>
              ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>_>_>
                *)&local_e0,
               "NameIndex @ {0:x}: Abbreviation {1:x}: {2} uses an unknown form: {3}.\n",&local_48,
               &Abbr->Code,&local_38.Index,&local_38.Form);
    raw_ostream::operator<<(prVar2,&local_e0.super_formatv_object_base);
  }
  else {
    local_40 = this;
    if (AttrEnc.Form == DW_FORM_data8 || AttrEnc.Index != DW_IDX_type_hash) {
      uVar3 = AttrEnc.Index - DW_IDX_compile_unit;
      if (3 < uVar3) {
        prVar2 = warn(this);
        local_48 = NI->Base;
        formatv<unsigned_long,_const_unsigned_int_&,_llvm::dwarf::Index_&>
                  ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index_&>_>_>
                    *)&local_e0,
                   "NameIndex @ {0:x}: Abbreviation {1:x} contains an unknown index attribute: {2}.\n"
                   ,&local_48,&Abbr->Code,&local_38.Index);
        raw_ostream::operator<<(prVar2,&local_e0.super_formatv_object_base);
        formatv_object_base::~formatv_object_base(&local_e0.super_formatv_object_base);
        return 0;
      }
      local_e0.super_formatv_object_base.Fmt.Length = 0;
      local_e0.super_formatv_object_base.Adapters.
      super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e0.super_formatv_object_base.Adapters.
      super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e0.super_formatv_object_base.Replacements.
      super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_e0.super_formatv_object_base.Fmt.Data._0_2_ = AttrEnc.Form;
      bVar1 = DWARFFormValue::isFormClass
                        ((DWARFFormValue *)&local_e0,verifyNameIndexAttribute::Table[uVar3].Class);
      if (bVar1) {
        return 0;
      }
      prVar2 = error(local_40);
      local_48 = NI->Base;
      formatv<unsigned_long,_const_unsigned_int_&,_llvm::dwarf::Index_&,_llvm::dwarf::Form_&,_const_llvm::StringLiteral_&>
                (&local_e0,
                 "NameIndex @ {0:x}: Abbreviation {1:x}: {2} uses an unexpected form {3} (expected form class {4}).\n"
                 ,&local_48,&Abbr->Code,&local_38.Index,&local_38.Form,
                 &verifyNameIndexAttribute::Table[uVar3].ClassName);
      raw_ostream::operator<<(prVar2,&local_e0.super_formatv_object_base);
    }
    else {
      prVar2 = error(this);
      local_48 = NI->Base;
      local_4a = DW_FORM_data8;
      formatv<unsigned_long,_const_unsigned_int_&,_llvm::dwarf::Form_&,_llvm::dwarf::Form>
                ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Form>_>_>
                  *)&local_e0,
                 "NameIndex @ {0:x}: Abbreviation {1:x}: DW_IDX_type_hash uses an unexpected form {2} (should be {3}).\n"
                 ,&local_48,&Abbr->Code,&local_38.Form,&local_4a);
      raw_ostream::operator<<(prVar2,&local_e0.super_formatv_object_base);
    }
  }
  formatv_object_base::~formatv_object_base(&local_e0.super_formatv_object_base);
  return 1;
}

Assistant:

unsigned DWARFVerifier::verifyNameIndexAttribute(
    const DWARFDebugNames::NameIndex &NI, const DWARFDebugNames::Abbrev &Abbr,
    DWARFDebugNames::AttributeEncoding AttrEnc) {
  StringRef FormName = dwarf::FormEncodingString(AttrEnc.Form);
  if (FormName.empty()) {
    error() << formatv("NameIndex @ {0:x}: Abbreviation {1:x}: {2} uses an "
                       "unknown form: {3}.\n",
                       NI.getUnitOffset(), Abbr.Code, AttrEnc.Index,
                       AttrEnc.Form);
    return 1;
  }

  if (AttrEnc.Index == DW_IDX_type_hash) {
    if (AttrEnc.Form != dwarf::DW_FORM_data8) {
      error() << formatv(
          "NameIndex @ {0:x}: Abbreviation {1:x}: DW_IDX_type_hash "
          "uses an unexpected form {2} (should be {3}).\n",
          NI.getUnitOffset(), Abbr.Code, AttrEnc.Form, dwarf::DW_FORM_data8);
      return 1;
    }
  }

  // A list of known index attributes and their expected form classes.
  // DW_IDX_type_hash is handled specially in the check above, as it has a
  // specific form (not just a form class) we should expect.
  struct FormClassTable {
    dwarf::Index Index;
    DWARFFormValue::FormClass Class;
    StringLiteral ClassName;
  };
  static constexpr FormClassTable Table[] = {
      {dwarf::DW_IDX_compile_unit, DWARFFormValue::FC_Constant, {"constant"}},
      {dwarf::DW_IDX_type_unit, DWARFFormValue::FC_Constant, {"constant"}},
      {dwarf::DW_IDX_die_offset, DWARFFormValue::FC_Reference, {"reference"}},
      {dwarf::DW_IDX_parent, DWARFFormValue::FC_Constant, {"constant"}},
  };

  ArrayRef<FormClassTable> TableRef(Table);
  auto Iter = find_if(TableRef, [AttrEnc](const FormClassTable &T) {
    return T.Index == AttrEnc.Index;
  });
  if (Iter == TableRef.end()) {
    warn() << formatv("NameIndex @ {0:x}: Abbreviation {1:x} contains an "
                      "unknown index attribute: {2}.\n",
                      NI.getUnitOffset(), Abbr.Code, AttrEnc.Index);
    return 0;
  }

  if (!DWARFFormValue(AttrEnc.Form).isFormClass(Iter->Class)) {
    error() << formatv("NameIndex @ {0:x}: Abbreviation {1:x}: {2} uses an "
                       "unexpected form {3} (expected form class {4}).\n",
                       NI.getUnitOffset(), Abbr.Code, AttrEnc.Index,
                       AttrEnc.Form, Iter->ClassName);
    return 1;
  }
  return 0;
}